

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_hkdf.cc
# Opt level: O0

int pkey_hkdf_init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  void *orig_ptr;
  HKDF_PKEY_CTX *hctx;
  EVP_PKEY_CTX *ctx_local;
  
  orig_ptr = OPENSSL_zalloc(0x60);
  if (orig_ptr == (void *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = CBB_init((CBB *)((long)orig_ptr + 0x30),0);
    if (iVar1 == 0) {
      OPENSSL_free(orig_ptr);
      ctx_local._4_4_ = 0;
    }
    else {
      ctx->data = orig_ptr;
      ctx_local._4_4_ = 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkey_hkdf_init(EVP_PKEY_CTX *ctx) {
  HKDF_PKEY_CTX *hctx =
      reinterpret_cast<HKDF_PKEY_CTX *>(OPENSSL_zalloc(sizeof(HKDF_PKEY_CTX)));
  if (hctx == NULL) {
    return 0;
  }

  if (!CBB_init(&hctx->info, 0)) {
    OPENSSL_free(hctx);
    return 0;
  }

  ctx->data = hctx;
  return 1;
}